

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus
DecodeMemMultipleWritebackInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  DecodeStatus DVar3;
  uint *Decoder_00;
  uint64_t Address_00;
  uint64_t Address_01;
  uint64_t Address_02;
  uint64_t Address_03;
  uint Rn;
  uint RegNo;
  
  RegNo = Insn >> 0x10 & 0xf;
  if (Insn >> 0x1c == 0xf) {
    uVar1 = MCInst_getOpcode(Inst);
    if (uVar1 - 0x92 < 9) {
      Decoder_00 = (uint *)((long)&switchD_001beb98::switchdataD_002ecc9c +
                           (long)(int)(&switchD_001beb98::switchdataD_002ecc9c)[uVar1 - 0x92]);
      switch(uVar1) {
      case 0x92:
        uVar1 = 0x11e;
        break;
      case 0x93:
        uVar1 = 0x11f;
        break;
      case 0x94:
        uVar1 = 0x120;
        break;
      case 0x95:
        uVar1 = 0x121;
        break;
      case 0x96:
        uVar1 = 0x122;
        break;
      case 0x97:
        return MCDisassembler_Fail;
      case 0x98:
        uVar1 = 0x123;
        break;
      case 0x99:
        uVar1 = 0x124;
        break;
      case 0x9a:
        uVar1 = 0x125;
      }
    }
    else {
      Decoder_00 = &switchD_001bec2d::switchdataD_002eccc0;
      switch(uVar1) {
      case 0x19c:
        uVar1 = 0x178;
        break;
      case 0x19d:
        uVar1 = 0x179;
        break;
      case 0x19e:
        uVar1 = 0x17a;
        break;
      case 0x19f:
        uVar1 = 0x17b;
        break;
      case 0x1a0:
        uVar1 = 0x17c;
        break;
      case 0x1a1:
        uVar1 = 0x17d;
        break;
      case 0x1a2:
        uVar1 = 0x17e;
        break;
      case 0x1a3:
        uVar1 = 0x17f;
        break;
      default:
        return MCDisassembler_Fail;
      }
    }
    MCInst_setOpcode(Inst,uVar1);
    if ((Insn >> 0x14 & 1) != 0) {
      MCOperand_CreateImm0(Inst,*(int64_t *)(&DAT_002fb4b0 + (Insn >> 0x14 & 0x18)));
      DVar2 = DecodeGPRRegisterClass(Inst,RegNo,Address_03,Decoder_00);
      return *(DecodeStatus *)(&DAT_002fb4d0 + (ulong)DVar2 * 4);
    }
    if ((Insn >> 0x16 & 1) != 0) {
      MCOperand_CreateImm0(Inst,(ulong)(Insn & 0xf));
      return MCDisassembler_Success;
    }
    return MCDisassembler_Fail;
  }
  DVar2 = DecodeGPRRegisterClass(Inst,RegNo,Address,Decoder);
  if ((DVar2 | 2) == MCDisassembler_Success) {
    DVar3 = DecodeGPRRegisterClass(Inst,RegNo,Address_00,Decoder);
    if (DVar3 != MCDisassembler_Success) {
      if (DVar3 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar2 = MCDisassembler_SoftFail;
    }
    DVar3 = DecodePredicateOperand(Inst,Insn >> 0x1c,Address_01,Decoder);
    if (DVar3 != MCDisassembler_Success) {
      if (DVar3 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar2 = MCDisassembler_SoftFail;
    }
    DVar3 = DecodeRegListOperand(Inst,Insn & 0xffff,Address_02,Decoder);
    if (DVar3 == MCDisassembler_Fail) {
      return MCDisassembler_Fail;
    }
    if (DVar3 == MCDisassembler_Success) {
      return DVar2;
    }
    if (DVar3 == MCDisassembler_SoftFail) {
      return MCDisassembler_SoftFail;
    }
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeMemMultipleWritebackInstruction(MCInst *Inst,
		unsigned Insn, uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	unsigned reglist = fieldFromInstruction_4(Insn, 0, 16);

	if (pred == 0xF) {
		// Ambiguous with RFE and SRS
		switch (MCInst_getOpcode(Inst)) {
			case ARM_LDMDA:
				MCInst_setOpcode(Inst, ARM_RFEDA);
				break;
			case ARM_LDMDA_UPD:
				MCInst_setOpcode(Inst, ARM_RFEDA_UPD);
				break;
			case ARM_LDMDB:
				MCInst_setOpcode(Inst, ARM_RFEDB);
				break;
			case ARM_LDMDB_UPD:
				MCInst_setOpcode(Inst, ARM_RFEDB_UPD);
				break;
			case ARM_LDMIA:
				MCInst_setOpcode(Inst, ARM_RFEIA);
				break;
			case ARM_LDMIA_UPD:
				MCInst_setOpcode(Inst, ARM_RFEIA_UPD);
				break;
			case ARM_LDMIB:
				MCInst_setOpcode(Inst, ARM_RFEIB);
				break;
			case ARM_LDMIB_UPD:
				MCInst_setOpcode(Inst, ARM_RFEIB_UPD);
				break;
			case ARM_STMDA:
				MCInst_setOpcode(Inst, ARM_SRSDA);
				break;
			case ARM_STMDA_UPD:
				MCInst_setOpcode(Inst, ARM_SRSDA_UPD);
				break;
			case ARM_STMDB:
				MCInst_setOpcode(Inst, ARM_SRSDB);
				break;
			case ARM_STMDB_UPD:
				MCInst_setOpcode(Inst, ARM_SRSDB_UPD);
				break;
			case ARM_STMIA:
				MCInst_setOpcode(Inst, ARM_SRSIA);
				break;
			case ARM_STMIA_UPD:
				MCInst_setOpcode(Inst, ARM_SRSIA_UPD);
				break;
			case ARM_STMIB:
				MCInst_setOpcode(Inst, ARM_SRSIB);
				break;
			case ARM_STMIB_UPD:
				MCInst_setOpcode(Inst, ARM_SRSIB_UPD);
				break;
			default:
				return MCDisassembler_Fail;
		}

		// For stores (which become SRS's, the only operand is the mode.
		if (fieldFromInstruction_4(Insn, 20, 1) == 0) {
			// Check SRS encoding constraints
			if (!(fieldFromInstruction_4(Insn, 22, 1) == 1 &&
						fieldFromInstruction_4(Insn, 20, 1) == 0))
				return MCDisassembler_Fail;

			MCOperand_CreateImm0(Inst, fieldFromInstruction_4(Insn, 0, 4));
			return S;
		}

		return DecodeRFEInstruction(Inst, Insn, Address, Decoder);
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail; // Tied
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeRegListOperand(Inst, reglist, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}